

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileExecutableTargetGenerator::WriteRuleFiles(cmMakefileExecutableTargetGenerator *this)

{
  bool bVar1;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteCommonCodeRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetLanguageFlags(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[7])(this,0);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[6])(this,0);
  bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,
                     &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      ConfigName);
  if (bVar1) {
    (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
      _vptr_cmCommonTargetGenerator[6])(this,1);
  }
  cmMakefileTargetGenerator::WriteTargetRequiresRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[5])(this);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteRuleFiles()
{
  // create the build.make file and directory, put in the common blocks
  this->CreateRuleFile();

  // write rules used to help build object files
  this->WriteCommonCodeRules();

  // write the per-target per-language flags
  this->WriteTargetLanguageFlags();

  // write in rules for object files and custom commands
  this->WriteTargetBuildRules();

  // write the device link rules
  this->WriteDeviceExecutableRule(false);

  // write the link rules
  this->WriteExecutableRule(false);
  if (this->GeneratorTarget->NeedRelinkBeforeInstall(this->ConfigName)) {
    // Write rules to link an installable version of the target.
    this->WriteExecutableRule(true);
  }

  // Write the requires target.
  this->WriteTargetRequiresRules();

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}